

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

View<int,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::operator=
          (View<int,_false,_std::allocator<unsigned_long>_> *this,int *value)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  size_t sVar4;
  reference piVar5;
  runtime_error *this_00;
  size_t sVar6;
  ulong uVar7;
  int *piVar8;
  iterator it;
  Iterator<int,_false,_std::allocator<unsigned_long>_> IStack_58;
  
  if (this->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_00111c38:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  testInvariant(this);
  if ((this->geometry_).isSimple_ == true) {
    sVar4 = (this->geometry_).size_;
    if (sVar4 == 0) {
      return this;
    }
    piVar2 = this->data_;
    sVar6 = 0;
    do {
      piVar2[sVar6] = *value;
      sVar6 = sVar6 + 1;
    } while (sVar4 != sVar6);
    return this;
  }
  piVar8 = this->data_;
  if (piVar8 == (int *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_00111c38;
  }
  switch((this->geometry_).dimension_) {
  case 1:
    sVar4 = shape(this,0);
    if (sVar4 != 0) {
      uVar7 = 0;
      do {
        *piVar8 = *value;
        sVar4 = strides(this,0);
        piVar8 = piVar8 + sVar4;
        uVar7 = uVar7 + 1;
        sVar4 = shape(this,0);
      } while (uVar7 < sVar4);
    }
    shape(this,0);
    sVar4 = 0;
    goto LAB_00111acd;
  case 2:
    marray_detail::
    OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
    ::operate(this,value,piVar8);
    break;
  case 3:
    sVar4 = shape(this,2);
    if (sVar4 != 0) {
      uVar7 = 0;
      do {
        marray_detail::
        OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(this,value,piVar8);
        sVar4 = strides(this,2);
        piVar8 = piVar8 + sVar4;
        uVar7 = uVar7 + 1;
        sVar4 = shape(this,2);
      } while (uVar7 < sVar4);
    }
    shape(this,2);
    sVar4 = 2;
LAB_00111acd:
    strides(this,sVar4);
    break;
  case 4:
    marray_detail::
    OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
    ::operate(this,value,piVar8);
    break;
  case 5:
    marray_detail::
    OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
    ::operate(this,value,piVar8);
    break;
  default:
    sVar4 = dimension(this);
    if (sVar4 == 6) {
      marray_detail::
      OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
      ::operate(this,value,this->data_);
    }
    else {
      sVar4 = dimension(this);
      if (sVar4 == 7) {
        marray_detail::
        OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(this,value,this->data_);
      }
      else {
        sVar4 = dimension(this);
        if (sVar4 == 8) {
          marray_detail::
          OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
          ::operate(this,value,this->data_);
        }
        else {
          sVar4 = dimension(this);
          if (sVar4 == 9) {
            marray_detail::
            OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
            ::operate(this,value,this->data_);
          }
          else {
            sVar4 = dimension(this);
            if (sVar4 == 10) {
              marray_detail::
              OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
              ::operate(this,value,this->data_);
            }
            else {
              testInvariant(this);
              Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&IStack_58,this,0);
              while (bVar3 = Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore
                                       (&IStack_58), bVar3) {
                iVar1 = *value;
                piVar5 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&IStack_58)
                ;
                *piVar5 = iVar1;
                Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&IStack_58);
              }
              if (IStack_58.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(IStack_58.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)IStack_58.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)IStack_58.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

inline View<T, isConst, A>& 
View<T, isConst, A>::operator=
(
    const T& value
)
{
    marray_detail::Assert(MARRAY_NO_DEBUG || data_ != 0);
    if(isSimple()) {
        for(std::size_t j=0; j<geometry_.size(); ++j) {
            data_[j] = value;
        }
    }
    else if(dimension() == 1)
        marray_detail::OperateHelperBinaryScalar<1, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 2)
        marray_detail::OperateHelperBinaryScalar<2, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 3)
        marray_detail::OperateHelperBinaryScalar<3, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 4)
        marray_detail::OperateHelperBinaryScalar<4, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 5)
        marray_detail::OperateHelperBinaryScalar<5, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 6)
        marray_detail::OperateHelperBinaryScalar<6, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 7)
        marray_detail::OperateHelperBinaryScalar<7, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 8)
        marray_detail::OperateHelperBinaryScalar<8, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 9)
        marray_detail::OperateHelperBinaryScalar<9, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 10)
        marray_detail::OperateHelperBinaryScalar<10, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else {
        for(iterator it = begin(); it.hasMore(); ++it) {
            *it = value;
        }
    }
    return *this;
}